

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  undefined2 *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  uint in_ECX;
  uint uVar12;
  ulong uVar13;
  uint in_EDX;
  long in_RSI;
  undefined2 *in_RDI;
  ushort in_R8W;
  undefined6 in_register_00000082;
  ulong in_R9;
  U32 minStatePlus;
  U32 maxBitsOut;
  uint s_3;
  uint total;
  BYTE s_2;
  U32 u_2;
  int freq;
  int nbOccurrences;
  U32 symbol;
  U32 position_1;
  size_t uPosition;
  size_t u_1;
  size_t unroll;
  size_t s_1;
  size_t position;
  int n;
  int i;
  U32 s;
  U64 sv;
  size_t pos;
  U64 add;
  BYTE *spread;
  U32 u;
  U32 highThreshold;
  BYTE *tableSymbol;
  U16 *cumul;
  U32 maxSV1;
  U32 step;
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCT;
  U16 *tableU16;
  void *ptr;
  U32 tableMask;
  U32 tableSize;
  uint local_104;
  uint local_f0;
  uint local_ec;
  uint local_e4;
  int local_dc;
  uint local_d8;
  uint local_d4;
  ulong local_c8;
  ulong local_b8;
  ulong local_b0;
  int local_a0;
  uint local_9c;
  U64 local_98;
  long local_90;
  uint local_78;
  uint local_74;
  size_t local_8;
  
  puVar4 = (undefined2 *)CONCAT62(in_register_00000082,in_R8W);
  bVar11 = (byte)in_ECX;
  uVar6 = 1 << (bVar11 & 0x1f);
  uVar7 = uVar6 - 1;
  if (in_ECX == 0) {
    local_104 = 1;
  }
  else {
    local_104 = uVar6 >> 1;
  }
  uVar13 = (ulong)local_104;
  uVar8 = (uVar6 >> 1) + (uVar6 >> 3) + 3;
  uVar9 = in_EDX + 1;
  uVar12 = in_EDX + 2;
  local_74 = uVar6 - 1;
  if ((in_R8W & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3809,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  if (in_R9 < (((ulong)(in_EDX + 2) + (1L << (bVar11 & 0x3f)) >> 1) + 2) * 4) {
    local_8 = 0xffffffffffffffd4;
  }
  else {
    *in_RDI = (short)in_ECX;
    in_RDI[1] = (short)in_EDX;
    if (0xf < in_ECX) {
      __assert_fail("tableLog < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x380e,
                    "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                   );
    }
    *puVar4 = 0;
    for (local_78 = 1; local_78 <= uVar9; local_78 = local_78 + 1) {
      if (*(short *)(in_RSI + (ulong)(local_78 - 1) * 2) == -1) {
        puVar4[local_78] = puVar4[local_78 - 1] + 1;
        *(char *)((long)puVar4 + (ulong)local_74 + (ulong)uVar12 * 2) = (char)local_78 + -1;
        local_74 = local_74 - 1;
      }
      else {
        if (*(short *)(in_RSI + (ulong)(local_78 - 1) * 2) < 0) {
          __assert_fail("normalizedCounter[u-1] >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x381f,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        puVar4[local_78] = puVar4[local_78 - 1] + *(short *)(in_RSI + (ulong)(local_78 - 1) * 2);
        if ((ushort)puVar4[local_78] < (ushort)puVar4[local_78 - 1]) {
          __assert_fail("cumul[u] >= cumul[u-1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3821,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
    }
    puVar4[uVar9] = (short)uVar6 + 1;
    if (local_74 == uVar6 - 1) {
      lVar5 = (ulong)uVar6 + (ulong)uVar12 * 2;
      local_90 = 0;
      local_98 = 0;
      for (local_9c = 0; local_9c < uVar9; local_9c = local_9c + 1) {
        iVar10 = (int)*(short *)(in_RSI + (ulong)local_9c * 2);
        MEM_write64((void *)((long)puVar4 + local_90 + lVar5),local_98);
        for (local_a0 = 8; local_a0 < iVar10; local_a0 = local_a0 + 8) {
          MEM_write64((void *)((long)puVar4 + (long)local_a0 + local_90 + lVar5),local_98);
        }
        if (iVar10 < 0) {
          __assert_fail("n>=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3837,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        local_90 = iVar10 + local_90;
        local_98 = local_98 + 0x101010101010101;
      }
      local_b0 = 0;
      if ((uVar6 & 1) != 0) {
        __assert_fail("tableSize % unroll == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3842,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      for (local_b8 = 0; local_b8 < uVar6; local_b8 = local_b8 + 2) {
        for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
          *(undefined1 *)
           ((long)puVar4 + (local_b0 + local_c8 * uVar8 & (ulong)uVar7) + (ulong)uVar12 * 2) =
               *(undefined1 *)((long)puVar4 + local_b8 + local_c8 + lVar5);
        }
        local_b0 = local_b0 + (ulong)uVar8 * 2 & (ulong)uVar7;
      }
      if (local_b0 != 0) {
        __assert_fail("position == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x384b,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    else {
      local_d4 = 0;
      for (local_d8 = 0; local_d8 < uVar9; local_d8 = local_d8 + 1) {
        sVar3 = *(short *)(in_RSI + (ulong)local_d8 * 2);
        for (local_dc = 0; local_dc < sVar3; local_dc = local_dc + 1) {
          *(char *)((long)puVar4 + (ulong)local_d4 + (ulong)uVar12 * 2) = (char)local_d8;
          do {
            local_d4 = local_d4 + uVar8 & uVar7;
          } while (local_74 < local_d4);
        }
      }
      if (local_d4 != 0) {
        __assert_fail("position==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3859,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    for (local_e4 = 0; local_e4 < uVar6; local_e4 = local_e4 + 1) {
      bVar1 = *(byte *)((long)puVar4 + (ulong)local_e4 + (ulong)uVar12 * 2);
      uVar2 = puVar4[bVar1];
      puVar4[bVar1] = uVar2 + 1;
      in_RDI[(ulong)uVar2 + 2] = (short)uVar6 + (short)local_e4;
    }
    local_ec = 0;
    for (local_f0 = 0; local_f0 <= in_EDX; local_f0 = local_f0 + 1) {
      sVar3 = *(short *)(in_RSI + (ulong)local_f0 * 2);
      if (sVar3 == -1) {
LAB_0016fb7b:
        *(uint *)(in_RDI + uVar13 * 2 + (ulong)local_f0 * 4 + 4) =
             in_ECX * 0x10000 - (1 << (bVar11 & 0x1f));
        if (0x7fffffff < local_ec) {
          __assert_fail("total <= INT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3870,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        *(uint *)(in_RDI + uVar13 * 2 + (ulong)local_f0 * 4 + 2) = local_ec - 1;
        local_ec = local_ec + 1;
      }
      else if (sVar3 == 0) {
        *(uint *)(in_RDI + uVar13 * 2 + (ulong)local_f0 * 4 + 4) =
             (in_ECX + 1) * 0x10000 - (1 << (bVar11 & 0x1f));
      }
      else {
        if (sVar3 == 1) goto LAB_0016fb7b;
        if (*(short *)(in_RSI + (ulong)local_f0 * 2) < 2) {
          __assert_fail("normalizedCounter[s] > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3875,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar6 = ZSTD_highbit32(0);
        *(uint *)(in_RDI + uVar13 * 2 + (ulong)local_f0 * 4 + 4) =
             (in_ECX - uVar6) * 0x10000 -
             ((int)*(short *)(in_RSI + (ulong)local_f0 * 2) << ((byte)(in_ECX - uVar6) & 0x1f));
        *(uint *)(in_RDI + uVar13 * 2 + (ulong)local_f0 * 4 + 2) =
             local_ec - (int)*(short *)(in_RSI + (ulong)local_f0 * 2);
        local_ec = (int)*(short *)(in_RSI + (ulong)local_f0 * 2) + local_ec;
      }
    }
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}